

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O2

void ImGui_ImplSDL2_UpdateGamepadAnalog
               (ImGui_ImplSDL2_Data *bd,ImGuiIO *io,ImGuiKey key,SDL_GameControllerAxis axis_no,
               float v0,float v1)

{
  int iVar1;
  _SDL_GameController **pp_Var2;
  short sVar3;
  long lVar4;
  float analog_value;
  float fVar5;
  float fVar6;
  
  pp_Var2 = (bd->Gamepads).Data;
  iVar1 = (bd->Gamepads).Size;
  analog_value = 0.0;
  for (lVar4 = 0; (long)iVar1 * 8 != lVar4; lVar4 = lVar4 + 8) {
    sVar3 = SDL_GameControllerGetAxis(*(undefined8 *)((long)pp_Var2 + lVar4),axis_no);
    fVar5 = ((float)(int)sVar3 - v0) / (v1 - v0);
    fVar6 = 1.0;
    if (fVar5 <= 1.0) {
      fVar6 = fVar5;
    }
    fVar6 = (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar6);
    if (fVar6 <= analog_value) {
      fVar6 = analog_value;
    }
    analog_value = fVar6;
  }
  ImGuiIO::AddKeyAnalogEvent(io,key,0.1 < analog_value,analog_value);
  return;
}

Assistant:

static void ImGui_ImplSDL2_UpdateGamepadAnalog(ImGui_ImplSDL2_Data* bd, ImGuiIO& io, ImGuiKey key, SDL_GameControllerAxis axis_no, float v0, float v1)
{
    float merged_value = 0.0f;
    for (SDL_GameController* gamepad : bd->Gamepads)
    {
        float vn = Saturate((float)(SDL_GameControllerGetAxis(gamepad, axis_no) - v0) / (float)(v1 - v0));
        if (merged_value < vn)
            merged_value = vn;
    }
    io.AddKeyAnalogEvent(key, merged_value > 0.1f, merged_value);
}